

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CountBFS<uttt::IBoard>(int depth)

{
  initializer_list<uttt::IBoard> __l;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference plVar4;
  size_type sVar5;
  int in_EDI;
  undefined1 auVar6 [16];
  rep millis;
  time_point t2;
  IBoard ng;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range3;
  vector<long,_std::allocator<long>_> moves;
  IBoard *g;
  iterator __end0;
  iterator __begin0;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__range2;
  time_point t1;
  int i;
  int current_level;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> levels [2];
  longlong total;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffdd8;
  IBoard *in_stack_fffffffffffffde0;
  IBoard *in_stack_fffffffffffffde8;
  IBoard *in_stack_fffffffffffffdf0;
  allocator_type *in_stack_fffffffffffffe08;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *pvVar7;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_fffffffffffffe10;
  iterator in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  IBoard *in_stack_fffffffffffffe48;
  duration<long,_std::ratio<1L,_1000L>_> local_120;
  rep local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  long local_f0;
  long *local_e8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [24];
  reference local_b8;
  IBoard *local_b0;
  __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  local_a8;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *local_a0;
  undefined8 local_98;
  int local_90;
  int local_8c;
  undefined1 local_86;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined8 local_58;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *local_50;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> local_48 [2];
  pointer local_10;
  int local_4;
  
  local_4 = in_EDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x18);
  std::operator<<(poVar3," bytes\n");
  local_10 = (pointer)0x1;
  local_86 = 1;
  local_50 = local_48;
  uttt::IBoard::IBoard(in_stack_fffffffffffffde0);
  local_60 = local_78;
  local_58 = 1;
  std::allocator<uttt::IBoard>::allocator((allocator<uttt::IBoard> *)0x1ee9a1);
  __l._M_len = in_stack_fffffffffffffe20;
  __l._M_array = in_stack_fffffffffffffe18;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            (in_stack_fffffffffffffe10,__l,in_stack_fffffffffffffe08);
  local_50 = local_48 + 1;
  do {
    pvVar7 = local_50;
    memset(local_50,0,0x18);
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)0x1eea21);
    local_50 = pvVar7 + 1;
  } while (local_50 !=
           (vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&stack0xffffffffffffffe8);
  local_86 = 0;
  std::allocator<uttt::IBoard>::~allocator((allocator<uttt::IBoard> *)0x1eea5f);
  local_8c = 0;
  for (local_90 = 0; local_90 < local_4; local_90 = local_90 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90 + 1);
    std::operator<<(poVar3,'\n');
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::clear
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)0x1eeafc);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = local_48 + local_8c;
    local_a8._M_current =
         (IBoard *)
         std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::begin
                   ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffdd8
                   );
    local_b0 = (IBoard *)
               std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::end
                         ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                          in_stack_fffffffffffffdd8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                               *)in_stack_fffffffffffffde0,
                              (__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                               *)in_stack_fffffffffffffdd8), bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                 ::operator*(&local_a8);
      iVar2 = uttt::IBoard::GetStatus(local_b8);
      if (iVar2 == -1) {
        uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffe48);
        local_d8 = local_d0;
        local_e0._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffdd8);
        local_e8 = (long *)std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffdd8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffde0,
                                  (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffdd8), bVar1) {
          plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&local_e0);
          local_f0 = *plVar4;
          local_f8 = *(undefined8 *)((local_b8->micro)._M_elems + 6);
          local_108._0_4_ = local_b8->macro;
          local_108._4_2_ = (local_b8->micro)._M_elems[0];
          local_108._6_2_ = (local_b8->micro)._M_elems[1];
          uStack_100 = *(undefined8 *)((local_b8->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(in_stack_fffffffffffffdf0,(IMove *)in_stack_fffffffffffffde8);
          std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::emplace_back<uttt::IBoard&>
                    ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&local_e0);
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdf0);
      }
      __gnu_cxx::
      __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>::
      operator++(&local_a8);
    }
    local_110 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffde8,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffde0);
    local_120.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffdd8);
    local_118 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_120);
    sVar5 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size
                      (local_48 + (1 - local_8c));
    local_10 = (pointer)((long)(local_10->micro)._M_elems + (sVar5 - 4));
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth count: ");
    sVar5 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size
                      (local_48 + (1 - local_8c));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3,", size: ");
    sVar5 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size
                      (local_48 + (1 - local_8c));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5 * 0x18 >> 0x14);
    std::operator<<(poVar3,"MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Total count: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(longlong)local_10);
    in_stack_fffffffffffffe48 = (IBoard *)std::operator<<(poVar3,", size: ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)in_stack_fffffffffffffe48,(ulong)((long)local_10 * 0x18) >> 0x14)
    ;
    std::operator<<(poVar3," MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_118 / 1000);
    poVar3 = std::operator<<(poVar3," seconds ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_118 % 1000);
    poVar3 = std::operator<<(poVar3," milliseconds, ");
    sVar5 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size
                      (local_48 + (1 - local_8c));
    auVar6._8_4_ = (int)(sVar5 >> 0x20);
    auVar6._0_8_ = sVar5;
    auVar6._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((auVar6._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                               (double)local_118) * 1000.0);
    std::operator<<(poVar3," nps\n");
    local_8c = 1 - local_8c;
  }
  pvVar7 = (vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&stack0xffffffffffffffe8;
  do {
    pvVar7 = pvVar7 + -1;
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffdf0);
  } while (pvVar7 != local_48);
  return;
}

Assistant:

void
static CountBFS(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::vector<IGame> levels[2] = {{{}}};
    int current_level = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::cout << "Working on depth: " << i + 1 << '\n';
        levels[1 - current_level].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : levels[current_level])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                levels[1 - current_level].emplace_back(ng);
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += levels[1 - current_level].size();
        std::cout << "Current depth count: " << levels[1 - current_level].size() << ", size: " << levels[1 - current_level].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Total count: " << total << ", size: " << total * sizeof(IGame) / (1 << 20) << " MB\n";
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(levels[1 - current_level].size()) / millis * 1000 << " nps\n";
        current_level = 1 - current_level;
    }
}